

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

int __thiscall CNetAddr::GetReachabilityFrom(CNetAddr *this,CNetAddr *paddrPartner)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined *puVar5;
  int iVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsRoutable(this);
  iVar6 = 0;
  if ((!bVar2) || (iVar6 = 0, this->m_net == NET_INTERNAL)) goto LAB_00d751a5;
  iVar3 = GetExtNetwork(this);
  iVar4 = GetExtNetwork(paddrPartner);
  bVar2 = IsRFC3964(this);
  iVar6 = 3;
  if ((!bVar2) && (bVar2 = IsRFC6052(this), !bVar2)) {
    bVar2 = IsRFC6145(this);
    iVar6 = (uint)!bVar2 * 2 + 3;
  }
  switch(iVar4) {
  case 1:
    iVar6 = (uint)(iVar3 == 1) * 3 + 1;
    break;
  case 2:
    if (iVar3 == 1) {
      iVar6 = 4;
    }
    else if ((iVar3 != 2) && (iVar6 = 1, iVar3 == 7)) {
      iVar6 = 2;
    }
    break;
  case 3:
    iVar6 = 4;
    if (iVar3 != 1) {
      iVar6 = (uint)(iVar3 == 3) * 5 + 1;
    }
    break;
  case 4:
    bVar2 = iVar3 == 4;
    goto LAB_00d7519d;
  case 5:
    bVar2 = iVar3 == 5;
LAB_00d7519d:
    iVar6 = (uint)bVar2 * 5 + 1;
    break;
  default:
    iVar6 = 1;
    if (6 < iVar3 - 1U) break;
    puVar5 = &DAT_0113d9fc;
    goto LAB_00d75171;
  case 7:
    iVar6 = 1;
    if (6 < iVar3 - 1U) break;
    puVar5 = &DAT_0113d9e0;
LAB_00d75171:
    iVar6 = *(int *)(puVar5 + (ulong)(iVar3 - 1) * 4);
  }
LAB_00d751a5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int CNetAddr::GetReachabilityFrom(const CNetAddr& paddrPartner) const
{
    enum Reachability {
        REACH_UNREACHABLE,
        REACH_DEFAULT,
        REACH_TEREDO,
        REACH_IPV6_WEAK,
        REACH_IPV4,
        REACH_IPV6_STRONG,
        REACH_PRIVATE
    };

    if (!IsRoutable() || IsInternal())
        return REACH_UNREACHABLE;

    int ourNet = GetExtNetwork(*this);
    int theirNet = GetExtNetwork(paddrPartner);
    bool fTunnel = IsRFC3964() || IsRFC6052() || IsRFC6145();

    switch(theirNet) {
    case NET_IPV4:
        switch(ourNet) {
        default:       return REACH_DEFAULT;
        case NET_IPV4: return REACH_IPV4;
        }
    case NET_IPV6:
        switch(ourNet) {
        default:         return REACH_DEFAULT;
        case NET_TEREDO: return REACH_TEREDO;
        case NET_IPV4:   return REACH_IPV4;
        case NET_IPV6:   return fTunnel ? REACH_IPV6_WEAK : REACH_IPV6_STRONG; // only prefer giving our IPv6 address if it's not tunnelled
        }
    case NET_ONION:
        switch(ourNet) {
        default:         return REACH_DEFAULT;
        case NET_IPV4:   return REACH_IPV4; // Tor users can connect to IPv4 as well
        case NET_ONION:    return REACH_PRIVATE;
        }
    case NET_I2P:
        switch (ourNet) {
        case NET_I2P: return REACH_PRIVATE;
        default: return REACH_DEFAULT;
        }
    case NET_CJDNS:
        switch (ourNet) {
        case NET_CJDNS: return REACH_PRIVATE;
        default: return REACH_DEFAULT;
        }
    case NET_TEREDO:
        switch(ourNet) {
        default:          return REACH_DEFAULT;
        case NET_TEREDO:  return REACH_TEREDO;
        case NET_IPV6:    return REACH_IPV6_WEAK;
        case NET_IPV4:    return REACH_IPV4;
        }
    case NET_UNROUTABLE:
    default:
        switch(ourNet) {
        default:          return REACH_DEFAULT;
        case NET_TEREDO:  return REACH_TEREDO;
        case NET_IPV6:    return REACH_IPV6_WEAK;
        case NET_IPV4:    return REACH_IPV4;
        case NET_ONION:     return REACH_PRIVATE; // either from Tor, or don't care about our address
        }
    }
}